

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true> *rng)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true> *d;
  _result_t<const_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>_&> it;
  take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>_>
  local_48;
  
  std::operator<<(sout,'[');
  view_adaptor<ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>,ranges::ref_view<std::vector<int,std::allocator<int>>>,(ranges::cardinality)-1>
  ::
  begin_cursor_<ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>const>
            ((adaptor_cursor_t<const_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>_>
              *)&it,(view_adaptor<ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>,ranges::ref_view<std::vector<int,std::allocator<int>>>,(ranges::cardinality)_1>
                     *)rng,d);
  _Var1._M_current =
       (((rng->
         super_view_adaptor<ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>,_ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_(ranges::cardinality)_1>
         ).rng_.rng_)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (it.
      super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>::adaptor<true>_>_>
      .
      super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>,_void>
      .
      super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>::adaptor<true>_>_>
      .
      super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
      .
      super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
      .value.
      super_adaptor_value_type_<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>,_0>
      .data_.
      super_box<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
      .value._M_current !=
      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_Var1._M_current) {
    while( true ) {
      adaptor_cursor<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>::adaptor<true>>
      ::
      read<ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>::adaptor<true>,ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>>>
                (&local_48,
                 (adaptor_cursor<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>::adaptor<true>>
                  *)&it);
      print_rng_<std::ostream,ranges::take_view<ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>>const>
                (sout,&local_48);
      adaptor_cursor<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>::adaptor<true>>
      ::
      next<ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>::adaptor<true>,void>
                ((adaptor_cursor<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::chunk_view_<ranges::ref_view<std::vector<int,std::allocator<int>>>,true>::adaptor<true>>
                  *)&it);
      if (it.
          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>::adaptor<true>_>_>
          .
          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>,_void>
          .
          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int>_>,_true>::adaptor<true>_>_>
          .
          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>_>
          .
          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
          .value.
          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_ranges::chunk_view_<ranges::ref_view<std::vector<int,_std::allocator<int>_>_>,_true>::adaptor<true>,_0>
          .data_.
          super_box<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
          .value._M_current ==
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_Var1._M_current)
      break;
      std::operator<<(sout,',');
    }
  }
  std::operator<<(sout,']');
  return sout;
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }